

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TZX.cpp
# Opt level: O3

void __thiscall Storage::Tape::TZX::get_next_pulses(TZX *this)

{
  FileHolder *this_00;
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  uint16_t uVar4;
  ulong offset;
  
  bVar1 = PulseQueuedTape::empty(&this->super_PulseQueuedTape);
  if (bVar1) {
    this_00 = &this->file_;
    do {
      uVar2 = FileHolder::get8(this_00);
      bVar1 = FileHolder::eof(this_00);
      if (bVar1) {
        PulseQueuedTape::set_is_at_end(&this->super_PulseQueuedTape,true);
        return;
      }
      switch(uVar2) {
      case '\x10':
        get_standard_speed_data_block(this);
        break;
      case '\x11':
        get_turbo_speed_data_block(this);
        break;
      case '\x12':
        get_pure_tone_data_block(this);
        break;
      case '\x13':
        get_pulse_sequence(this);
        break;
      case '\x14':
        get_pure_data_block(this);
        break;
      case '\x15':
        get_direct_recording_block(this);
        break;
      case '\x16':
      case '\x17':
      case '\x1a':
      case '\x1b':
      case '\x1c':
      case '\x1d':
      case '\x1e':
      case '\x1f':
      case ')':
      case ',':
      case '-':
      case '.':
      case '/':
      case '4':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case ';':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
switchD_0044c5e7_caseD_16:
        get_next_pulses();
        return;
      case '\x18':
        get_csw_recording_block(this);
        break;
      case '\x19':
        get_generalised_data_block(this);
        break;
      case ' ':
        get_pause(this);
        break;
      case '!':
      case '0':
        bVar3 = FileHolder::get8(this_00);
        offset = (ulong)bVar3;
        goto LAB_0044c68e;
      case '\"':
      case '%':
      case '\'':
        break;
      case '#':
      case '$':
        FileHolder::get16le(this_00);
        break;
      case '&':
        uVar4 = FileHolder::get16le(this_00);
        offset = (ulong)((uint)uVar4 * 2);
        goto LAB_0044c68e;
      case '(':
      case '2':
        uVar4 = FileHolder::get16le(this_00);
        offset = (ulong)uVar4;
        goto LAB_0044c68e;
      case '*':
        offset = 4;
        goto LAB_0044c68e;
      case '+':
        FileHolder::seek(this_00,4,1);
        uVar2 = FileHolder::get8(this_00);
        this->current_level_ = uVar2 != '\0';
        break;
      case '1':
        ignore_message_block(this);
        break;
      case '3':
        bVar3 = FileHolder::get8(this_00);
        offset = (ulong)bVar3 * 3;
        goto LAB_0044c68e;
      case '5':
        ignore_custom_info_block(this);
        break;
      case 'K':
        get_kansas_city_block(this);
        break;
      default:
        if (uVar2 != 'Z') goto switchD_0044c5e7_caseD_16;
        offset = 9;
LAB_0044c68e:
        FileHolder::seek(this_00,offset,1);
      }
      bVar1 = PulseQueuedTape::empty(&this->super_PulseQueuedTape);
    } while (bVar1);
  }
  return;
}

Assistant:

void TZX::get_next_pulses() {
	while(empty()) {
		uint8_t chunk_id = file_.get8();
		if(file_.eof()) {
			set_is_at_end(true);
			return;
		}

		switch(chunk_id) {
			case 0x10:	get_standard_speed_data_block();	break;
			case 0x11:	get_turbo_speed_data_block();		break;
			case 0x12:	get_pure_tone_data_block();			break;
			case 0x13:	get_pulse_sequence();				break;
			case 0x14:	get_pure_data_block();				break;
			case 0x15:	get_direct_recording_block();		break;
			case 0x18:	get_csw_recording_block();			break;
			case 0x19:	get_generalised_data_block();		break;
			case 0x20:	get_pause();						break;

			case 0x21:	ignore_group_start();				break;
			case 0x22:	ignore_group_end();					break;
			case 0x23:	ignore_jump_to_block();				break;
			case 0x24:	ignore_loop_start();				break;
			case 0x25:	ignore_loop_end();					break;
			case 0x26:	ignore_call_sequence();				break;
			case 0x27:	ignore_return_from_sequence();		break;
			case 0x28:	ignore_select_block();				break;
			case 0x2a:	ignore_stop_tape_if_in_48kb_mode();	break;

			case 0x2b:	get_set_signal_level();				break;

			case 0x30:	ignore_text_description();			break;
			case 0x31:	ignore_message_block();				break;
			case 0x32:	ignore_archive_info();				break;
			case 0x33:	get_hardware_type();				break;
			case 0x35:	ignore_custom_info_block();			break;

			case 0x4b:	get_kansas_city_block();			break;

			case 0x5a:	ignore_glue_block();				break;

			default:
				// In TZX each chunk has a different way of stating or implying its length,
				// so there is no route past an unimplemented chunk.
				logger.error().append("Unknown TZX chunk: %04x", chunk_id);
				set_is_at_end(true);
			return;
		}
	}
}